

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O1

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  pointer *pppPVar1;
  Pair *pPVar2;
  pointer __dest;
  const_iterator cVar3;
  mapped_type *pmVar4;
  pointer ppPVar5;
  pointer __src;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
                  *)this,variable);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
             ::operator[](&this->WatchMap,variable);
    ppPVar5 = (pmVar4->
              super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    __dest = ppPVar5;
    for (; ppPVar5 !=
           (pmVar4->
           super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>).
           _M_impl.super__Vector_impl_data._M_finish; ppPVar5 = ppPVar5 + 1) {
      __src = __dest + 1;
      pPVar2 = *ppPVar5;
      if ((pPVar2->Method == method) &&
         ((client_data == (void *)0x0 || (pPVar2->ClientData == client_data)))) {
        if ((pPVar2->DeleteDataCall != (DeleteData)0x0) && (pPVar2->ClientData != (void *)0x0)) {
          (*pPVar2->DeleteDataCall)(pPVar2->ClientData);
        }
        operator_delete(pPVar2,0x18);
        ppPVar5 = (pmVar4->
                  super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppPVar5) {
          memmove(__dest,__src,(long)ppPVar5 - (long)__src);
        }
        pppPVar1 = &(pmVar4->
                    super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + -1;
        return;
      }
      __dest = __src;
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method,
                                  void* client_data /*=0*/)
{
  if ( !this->WatchMap.count(variable) )
    {
    return;
    }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for ( it = vp->begin(); it != vp->end(); ++it )
    {
    if ( (*it)->Method == method &&
         // If client_data is NULL, we want to disconnect all watches against
         // the given method; otherwise match ClientData as well.
         (!client_data || (client_data == (*it)->ClientData)))
      {
      delete *it;
      vp->erase(it);
      return;
      }
    }
}